

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgrays.c
# Opt level: O0

void gray_render_line(gray_PWorker worker,TPos to_x,TPos to_y)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int ey;
  int ex;
  int iVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  bool local_79;
  long local_78;
  long local_70;
  FT_Int64 dy_r;
  FT_Int64 dx_r;
  FT_Int64 prod;
  TCoord ey2;
  TCoord ex2;
  TCoord ey1;
  TCoord ex1;
  TCoord fy2;
  TCoord fx2;
  TCoord fy1;
  TCoord fx1;
  TPos dy;
  TPos dx;
  TPos to_y_local;
  TPos to_x_local;
  gray_PWorker worker_local;
  
  ey2 = (TCoord)((ulong)worker->y >> 8);
  ey = (int)((ulong)to_y >> 8);
  if (((ey2 < worker->max_ey) || (ey < worker->max_ey)) &&
     ((worker->min_ey <= ey2 || (worker->min_ey <= ey)))) {
    ex2 = (TCoord)((ulong)worker->x >> 8);
    ex = (int)((ulong)to_x >> 8);
    fx2 = (uint)worker->x & 0xff;
    fy2 = (uint)worker->y & 0xff;
    lVar5 = to_x - worker->x;
    lVar6 = to_y - worker->y;
    if ((ex2 != ex) || (ey2 != ey)) {
      if (lVar6 == 0) {
        gray_set_cell(worker,ex,ey);
        goto LAB_0033ea24;
      }
      if (lVar5 == 0) {
        if (lVar6 < 1) {
          do {
            worker->cell->cover = worker->cell->cover - fy2;
            worker->cell->area = worker->cell->area + -fy2 * fx2 * 2;
            fy2 = 0x100;
            ey2 = ey2 + -1;
            gray_set_cell(worker,ex2,ey2);
          } while (ey2 != ey);
        }
        else {
          do {
            worker->cell->cover = worker->cell->cover + (0x100 - fy2);
            worker->cell->area = worker->cell->area + (0x100 - fy2) * fx2 * 2;
            fy2 = 0;
            ey2 = ey2 + 1;
            gray_set_cell(worker,ex2,ey2);
          } while (ey2 != ey);
        }
      }
      else {
        dx_r = lVar5 * fy2 - lVar6 * fx2;
        if (ex2 == ex) {
          local_70 = 0;
        }
        else {
          auVar1._8_8_ = 0;
          auVar1._0_8_ = SUB168(SEXT816(0xffffffff),8);
          local_70 = SUB168((auVar1 << 0x40 | ZEXT816(0xffffffff)) / SEXT816(lVar5),0);
        }
        if (ey2 == ey) {
          local_78 = 0;
        }
        else {
          auVar2._8_8_ = 0;
          auVar2._0_8_ = SUB168(SEXT816(0xffffffff),8);
          local_78 = SUB168((auVar2 << 0x40 | ZEXT816(0xffffffff)) / SEXT816(lVar6),0);
        }
        do {
          if ((dx_r + lVar5 * -0x100 < 1) || (0 < dx_r)) {
            if ((dx_r + lVar5 * -0x100 + lVar6 * 0x100 < 1) || (0 < dx_r + lVar5 * -0x100)) {
              if ((dx_r + lVar6 * 0x100 < 0) || (0 < dx_r + lVar5 * -0x100 + lVar6 * 0x100)) {
                iVar3 = (int)((ulong)(dx_r * -local_78) >> 0x20);
                dx_r = lVar5 * 0x100 + dx_r;
                worker->cell->cover = worker->cell->cover - fy2;
                worker->cell->area = worker->cell->area + -fy2 * (fx2 + iVar3);
                fy2 = 0x100;
                ey2 = ey2 + -1;
                fx2 = iVar3;
              }
              else {
                dx_r = lVar6 * 0x100 + dx_r;
                iVar3 = (int)((ulong)(dx_r * local_70) >> 0x20);
                worker->cell->cover = worker->cell->cover + (iVar3 - fy2);
                worker->cell->area = worker->cell->area + (iVar3 - fy2) * (fx2 + 0x100);
                fx2 = 0;
                ex2 = ex2 + 1;
                fy2 = iVar3;
              }
            }
            else {
              dx_r = dx_r + lVar5 * -0x100;
              iVar3 = (int)((ulong)(-dx_r * local_78) >> 0x20);
              worker->cell->cover = worker->cell->cover + (0x100 - fy2);
              worker->cell->area = worker->cell->area + (0x100 - fy2) * (fx2 + iVar3);
              fy2 = 0;
              ey2 = ey2 + 1;
              fx2 = iVar3;
            }
          }
          else {
            iVar3 = (int)((ulong)(-dx_r * -local_70) >> 0x20);
            dx_r = dx_r + lVar6 * -0x100;
            worker->cell->cover = worker->cell->cover + (iVar3 - fy2);
            worker->cell->area = worker->cell->area + (iVar3 - fy2) * fx2;
            fx2 = 0x100;
            ex2 = ex2 + -1;
            fy2 = iVar3;
          }
          gray_set_cell(worker,ex2,ey2);
          local_79 = ex2 != ex || ey2 != ey;
        } while (local_79);
      }
    }
    uVar4 = (uint)to_y & 0xff;
    worker->cell->cover = worker->cell->cover + (uVar4 - fy2);
    worker->cell->area = worker->cell->area + (uVar4 - fy2) * (fx2 + ((uint)to_x & 0xff));
  }
LAB_0033ea24:
  worker->x = to_x;
  worker->y = to_y;
  return;
}

Assistant:

static void
  gray_render_line( RAS_ARG_ TPos  to_x,
                             TPos  to_y )
  {
    TPos    dx, dy;
    TCoord  fx1, fy1, fx2, fy2;
    TCoord  ex1, ey1, ex2, ey2;


    ey1 = TRUNC( ras.y );
    ey2 = TRUNC( to_y );

    /* perform vertical clipping */
    if ( ( ey1 >= ras.max_ey && ey2 >= ras.max_ey ) ||
         ( ey1 <  ras.min_ey && ey2 <  ras.min_ey ) )
      goto End;

    ex1 = TRUNC( ras.x );
    ex2 = TRUNC( to_x );

    fx1 = FRACT( ras.x );
    fy1 = FRACT( ras.y );

    dx = to_x - ras.x;
    dy = to_y - ras.y;

    if ( ex1 == ex2 && ey1 == ey2 )       /* inside one cell */
      ;
    else if ( dy == 0 ) /* ex1 != ex2 */  /* any horizontal line */
    {
      gray_set_cell( RAS_VAR_ ex2, ey2 );
      goto End;
    }
    else if ( dx == 0 )
    {
      if ( dy > 0 )                       /* vertical line up */
        do
        {
          fy2 = ONE_PIXEL;
          FT_INTEGRATE( ras, fy2 - fy1, fx1 * 2 );
          fy1 = 0;
          ey1++;
          gray_set_cell( RAS_VAR_ ex1, ey1 );
        } while ( ey1 != ey2 );
      else                                /* vertical line down */
        do
        {
          fy2 = 0;
          FT_INTEGRATE( ras, fy2 - fy1, fx1 * 2 );
          fy1 = ONE_PIXEL;
          ey1--;
          gray_set_cell( RAS_VAR_ ex1, ey1 );
        } while ( ey1 != ey2 );
    }
    else                                  /* any other line */
    {
      FT_Int64  prod = dx * (FT_Int64)fy1 - dy * (FT_Int64)fx1;
      FT_UDIVPREP( ex1 != ex2, dx );
      FT_UDIVPREP( ey1 != ey2, dy );


      /* The fundamental value `prod' determines which side and the  */
      /* exact coordinate where the line exits current cell.  It is  */
      /* also easily updated when moving from one cell to the next.  */
      do
      {
        if      ( prod - dx * ONE_PIXEL                  >  0 &&
                  prod                                   <= 0 ) /* left */
        {
          fx2 = 0;
          fy2 = FT_UDIV( -prod, -dx );
          prod -= dy * ONE_PIXEL;
          FT_INTEGRATE( ras, fy2 - fy1, fx1 + fx2 );
          fx1 = ONE_PIXEL;
          fy1 = fy2;
          ex1--;
        }
        else if ( prod - dx * ONE_PIXEL + dy * ONE_PIXEL >  0 &&
                  prod - dx * ONE_PIXEL                  <= 0 ) /* up */
        {
          prod -= dx * ONE_PIXEL;
          fx2 = FT_UDIV( -prod, dy );
          fy2 = ONE_PIXEL;
          FT_INTEGRATE( ras, fy2 - fy1, fx1 + fx2 );
          fx1 = fx2;
          fy1 = 0;
          ey1++;
        }
        else if ( prod                  + dy * ONE_PIXEL >= 0 &&
                  prod - dx * ONE_PIXEL + dy * ONE_PIXEL <= 0 ) /* right */
        {
          prod += dy * ONE_PIXEL;
          fx2 = ONE_PIXEL;
          fy2 = FT_UDIV( prod, dx );
          FT_INTEGRATE( ras, fy2 - fy1, fx1 + fx2 );
          fx1 = 0;
          fy1 = fy2;
          ex1++;
        }
        else /* ( prod                                   >  0 &&
                  prod                  + dy * ONE_PIXEL <  0 )    down */
        {
          fx2 = FT_UDIV( prod, -dy );
          fy2 = 0;
          prod += dx * ONE_PIXEL;
          FT_INTEGRATE( ras, fy2 - fy1, fx1 + fx2 );
          fx1 = fx2;
          fy1 = ONE_PIXEL;
          ey1--;
        }

        gray_set_cell( RAS_VAR_ ex1, ey1 );

      } while ( ex1 != ex2 || ey1 != ey2 );
    }

    fx2 = FRACT( to_x );
    fy2 = FRACT( to_y );

    FT_INTEGRATE( ras, fy2 - fy1, fx1 + fx2 );

  End:
    ras.x = to_x;
    ras.y = to_y;
  }